

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O3

void __thiscall
QNetworkAccessBackend::QNetworkAccessBackend
          (QNetworkAccessBackend *this,TargetTypes targetTypes,SecurityFeatures securityFeatures,
          IOFeatures ioFeatures)

{
  long lVar1;
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0xb8);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QNetworkAccessBackendPrivate_002ca7c8;
  *(undefined8 *)(this_00 + 0x78) = 0;
  *(undefined4 *)(this_00 + 0x80) = 0;
  *(undefined8 *)(this_00 + 0x88) = 0;
  *(undefined8 *)(this_00 + 0x90) = 0;
  *(undefined8 *)(this_00 + 0x98) = 0;
  *(undefined8 *)(this_00 + 0xa0) = 0;
  *(undefined8 *)(this_00 + 0xa2) = 0;
  *(undefined8 *)(this_00 + 0xaa) = 0;
  QObject::QObject((QObject *)this,this_00,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002ca548;
  lVar1 = *(long *)(this + 8);
  ((QFlagsStorageHelper<QNetworkAccessBackend::TargetType,_4> *)(lVar1 + 0x78))->
  super_QFlagsStorage<QNetworkAccessBackend::TargetType> =
       (QFlagsStorage<QNetworkAccessBackend::TargetType>)
       targetTypes.super_QFlagsStorageHelper<QNetworkAccessBackend::TargetType,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::TargetType>.i;
  ((QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4> *)(lVar1 + 0x7c))->
  super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature> =
       (QFlagsStorage<QNetworkAccessBackend::SecurityFeature>)
       securityFeatures.super_QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature>.i;
  ((QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4> *)(lVar1 + 0x80))->
  super_QFlagsStorage<QNetworkAccessBackend::IOFeature> =
       (QFlagsStorage<QNetworkAccessBackend::IOFeature>)
       ioFeatures.super_QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::IOFeature>.i;
  return;
}

Assistant:

QNetworkAccessBackend::QNetworkAccessBackend(TargetTypes targetTypes,
                                             SecurityFeatures securityFeatures,
                                             IOFeatures ioFeatures)
    : QObject(*(new QNetworkAccessBackendPrivate), nullptr)
{
    Q_D(QNetworkAccessBackend);
    d->m_targetTypes = targetTypes;
    d->m_securityFeatures = securityFeatures;
    d->m_ioFeatures = ioFeatures;
}